

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

void __thiscall
deqp::ub::StructType::addMember(StructType *this,char *name,VarType *type,deUint32 flags)

{
  StructMember local_50;
  
  StructMember::StructMember(&local_50,name,type,flags);
  std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>::
  emplace_back<deqp::ub::StructMember>(&this->m_members,&local_50);
  StructMember::~StructMember(&local_50);
  return;
}

Assistant:

void StructType::addMember(const char* name, const VarType& type, deUint32 flags)
{
	m_members.push_back(StructMember(name, type, flags));
}